

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractbutton.cpp
# Opt level: O0

void __thiscall QAbstractButton::setAutoRepeat(QAbstractButton *this,bool autoRepeat)

{
  byte bVar1;
  QAbstractButtonPrivate *obj;
  byte in_SIL;
  int in_stack_0000000c;
  QAbstractButtonPrivate *d;
  undefined7 in_stack_fffffffffffffff0;
  
  bVar1 = in_SIL & 1;
  obj = d_func((QAbstractButton *)0x500155);
  if (((byte)obj->field_0x28c >> 2 & 1) != (bVar1 & 1)) {
    obj->field_0x28c = obj->field_0x28c & 0xfb | (bVar1 & 1) << 2;
    if ((((byte)obj->field_0x28c >> 2 & 1) == 0) || (((byte)obj->field_0x28c >> 4 & 1) == 0)) {
      QBasicTimer::stop();
    }
    else {
      QBasicTimer::start((QBasicTimer *)CONCAT17(bVar1,in_stack_fffffffffffffff0),in_stack_0000000c,
                         (QObject *)obj);
    }
  }
  return;
}

Assistant:

void QAbstractButton::setAutoRepeat(bool autoRepeat)
{
    Q_D(QAbstractButton);
    if (d->autoRepeat == autoRepeat)
        return;
    d->autoRepeat = autoRepeat;
    if (d->autoRepeat && d->down)
        d->repeatTimer.start(d->autoRepeatDelay, this);
    else
        d->repeatTimer.stop();
}